

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86_avx512::forward_inplace
          (HardSigmoid_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 auVar9 [16];
  undefined1 auVar10 [32];
  undefined1 (*pauVar7) [64];
  int iVar8;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined4 uVar18;
  
  iVar4 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar6 = 0;
  uVar5 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar5 = uVar6;
  }
  auVar11 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  auVar14._16_4_ = 0x3f800000;
  auVar14._20_4_ = 0x3f800000;
  auVar14._24_4_ = 0x3f800000;
  auVar14._28_4_ = 0x3f800000;
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  for (; uVar6 != uVar5; uVar6 = uVar6 + 1) {
    pauVar7 = (undefined1 (*) [64])
              (bottom_top_blob->cstep * uVar6 * bottom_top_blob->elemsize +
              (long)bottom_top_blob->data);
    pp_Var2 = this->_vptr_HardSigmoid_x86_avx512;
    for (iVar8 = 0; iVar8 + 0xf < iVar4; iVar8 = iVar8 + 0x10) {
      auVar12 = vbroadcastss_avx512f(ZEXT416(*(uint *)(&this->field_0xd0 + (long)pp_Var2[-3])));
      uVar18 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var2[-3]);
      auVar13._4_4_ = uVar18;
      auVar13._0_4_ = uVar18;
      auVar13._8_4_ = uVar18;
      auVar13._12_4_ = uVar18;
      auVar13._16_4_ = uVar18;
      auVar13._20_4_ = uVar18;
      auVar13._24_4_ = uVar18;
      auVar13._28_4_ = uVar18;
      auVar13._32_4_ = uVar18;
      auVar13._36_4_ = uVar18;
      auVar13._40_4_ = uVar18;
      auVar13._44_4_ = uVar18;
      auVar13._48_4_ = uVar18;
      auVar13._52_4_ = uVar18;
      auVar13._56_4_ = uVar18;
      auVar13._60_4_ = uVar18;
      auVar13 = vfmadd213ps_avx512f(auVar12,*pauVar7,auVar13);
      auVar13 = vmaxps_avx512f(auVar13,ZEXT1664(ZEXT816(0) << 0x40));
      auVar13 = vminps_avx512f(auVar13,auVar11);
      *pauVar7 = auVar13;
      pauVar7 = pauVar7 + 1;
    }
    pp_Var2 = this->_vptr_HardSigmoid_x86_avx512;
    for (; iVar8 + 7 < iVar4; iVar8 = iVar8 + 8) {
      uVar18 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var2[-3]);
      auVar17._4_4_ = uVar18;
      auVar17._0_4_ = uVar18;
      auVar17._8_4_ = uVar18;
      auVar17._12_4_ = uVar18;
      auVar17._16_4_ = uVar18;
      auVar17._20_4_ = uVar18;
      auVar17._24_4_ = uVar18;
      auVar17._28_4_ = uVar18;
      uVar18 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var2[-3]);
      auVar10._4_4_ = uVar18;
      auVar10._0_4_ = uVar18;
      auVar10._8_4_ = uVar18;
      auVar10._12_4_ = uVar18;
      auVar10._16_4_ = uVar18;
      auVar10._20_4_ = uVar18;
      auVar10._24_4_ = uVar18;
      auVar10._28_4_ = uVar18;
      auVar10 = vfmadd213ps_avx512vl(auVar17,*(undefined1 (*) [32])*pauVar7,auVar10);
      auVar10 = vmaxps_avx(auVar10,ZEXT1632(ZEXT816(0) << 0x40));
      auVar10 = vminps_avx(auVar10,auVar14);
      *(undefined1 (*) [32])*pauVar7 = auVar10;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x20);
    }
    pp_Var2 = this->_vptr_HardSigmoid_x86_avx512;
    for (; iVar8 + 3 < iVar4; iVar8 = iVar8 + 4) {
      uVar18 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var2[-3]);
      auVar16._4_4_ = uVar18;
      auVar16._0_4_ = uVar18;
      auVar16._8_4_ = uVar18;
      auVar16._12_4_ = uVar18;
      uVar18 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var2[-3]);
      auVar9._4_4_ = uVar18;
      auVar9._0_4_ = uVar18;
      auVar9._8_4_ = uVar18;
      auVar9._12_4_ = uVar18;
      auVar9 = vfmadd213ps_avx512vl(auVar16,*(undefined1 (*) [16])*pauVar7,auVar9);
      auVar9 = vmaxps_avx(auVar9,ZEXT816(0) << 0x40);
      auVar9 = vminps_avx(auVar9,auVar15);
      *(undefined1 (*) [16])*pauVar7 = auVar9;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 0x10);
    }
    pp_Var2 = this->_vptr_HardSigmoid_x86_avx512;
    for (; iVar8 < iVar4; iVar8 = iVar8 + 1) {
      fVar1 = *(float *)*pauVar7;
      p_Var3 = pp_Var2[-3];
      uVar18 = 0;
      if ((*(float *)(&this->field_0xd8 + (long)p_Var3) <= fVar1) &&
         (uVar18 = 0x3f800000, fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var3))) {
        auVar9 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                 ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var3)),
                                 ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var3)));
        uVar18 = auVar9._0_4_;
      }
      *(undefined4 *)*pauVar7 = uVar18;
      pauVar7 = (undefined1 (*) [64])(*pauVar7 + 4);
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}